

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppcVar4;
  cmMakefile *pcVar5;
  cmake *pcVar6;
  pointer pcVar7;
  ostream *poVar8;
  PolicyID id;
  PolicyID id_00;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  float local_564;
  allocator<char> local_519;
  string local_518;
  cmListFileBacktrace local_4f8;
  string local_4e0;
  reference local_4c0;
  string *t_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  undefined1 local_480 [8];
  ostringstream w_1;
  cmListFileBacktrace local_308;
  string local_2f0;
  reference local_2d0;
  string *t;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_290 [8];
  ostringstream w;
  cmListFileBacktrace local_118;
  allocator<char> local_f9;
  string local_f8;
  reference local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>
  *buildExpSet;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
  *__range1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  uint local_14;
  cmGlobalGenerator *pcStack_10;
  uint i;
  cmGlobalGenerator *this_local;
  
  pcStack_10 = this;
  (*this->_vptr_cmGlobalGenerator[0x31])();
  ProcessEvaluationFiles(this);
  for (local_14 = 0; uVar2 = (ulong)local_14,
      sVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators), uVar2 < sVar3; local_14 = local_14 + 1) {
    this_00 = &this->LocalGenerators;
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    pcVar5 = cmLocalGenerator::GetMakefile(*ppcVar4);
    SetCurrentMakefile(this,pcVar5);
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    (*(*ppcVar4)->_vptr_cmLocalGenerator[2])();
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (this_00,(ulong)local_14);
    pcVar5 = cmLocalGenerator::GetMakefile(*ppcVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CMAKE_SKIP_INSTALL_RULES",&local_39);
    bVar1 = cmMakefile::IsOn(pcVar5,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)local_14);
      cmLocalGenerator::GenerateInstallRules(*ppcVar4);
    }
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)local_14);
    cmLocalGenerator::GenerateTestFiles(*ppcVar4);
    pcVar6 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Generating",&local_71);
    uVar2 = (ulong)local_14;
    sVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    local_564 = (float)sVar3;
    cmake::UpdateProgress(pcVar6,&local_70,((float)uVar2 + 1.0) / local_564);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  SetCurrentMakefile(this,(cmMakefile *)0x0);
  bVar1 = GenerateCPackPropertiesFile(this);
  if (!bVar1) {
    pcVar6 = GetCMakeInstance(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Could not write CPack properties file.",&local_99);
    __range1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
                *)0x0;
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range1);
    cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_98,(cmListFileBacktrace *)&__range1);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
           ::begin(&this->BuildExportSets);
  buildExpSet = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
                   ::end(&this->BuildExportSets);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&buildExpSet);
    if (!bVar1) {
      CheckRuleHashes(this);
      WriteSummary(this);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->ExtraGenerator);
      if (bVar1) {
        pcVar7 = std::
                 unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
                 ::operator->(&this->ExtraGenerator);
        (*pcVar7->_vptr_cmExternalMakefileProjectGenerator[4])();
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->CMP0042WarnTargets);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&__range2,(cmPolicies *)0x2a,id);
        poVar8 = std::operator<<((ostream *)local_290,(string *)&__range2);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&__range2);
        std::operator<<((ostream *)local_290,
                        "MACOSX_RPATH is not specified for the following targets:\n");
        __end2 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->CMP0042WarnTargets);
        t = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->CMP0042WarnTargets);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&t), bVar1) {
          local_2d0 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end2);
          poVar8 = std::operator<<((ostream *)local_290," ");
          poVar8 = std::operator<<(poVar8,(string *)local_2d0);
          std::operator<<(poVar8,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
        pcVar6 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        local_308.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_308.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_308);
        cmake::IssueMessage(pcVar6,AUTHOR_WARNING,&local_2f0,&local_308);
        cmListFileBacktrace::~cmListFileBacktrace(&local_308);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
      }
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->CMP0068WarnTargets);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_480);
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&__range2_1,(cmPolicies *)0x44,id_00);
        poVar8 = std::operator<<((ostream *)local_480,(string *)&__range2_1);
        std::operator<<(poVar8,
                        "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                       );
        std::__cxx11::string::~string((string *)&__range2_1);
        __end2_1 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CMP0068WarnTargets);
        t_1 = (string *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CMP0068WarnTargets);
        while (bVar1 = std::operator!=(&__end2_1,(_Self *)&t_1), bVar1) {
          local_4c0 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end2_1);
          poVar8 = std::operator<<((ostream *)local_480," ");
          poVar8 = std::operator<<(poVar8,(string *)local_4c0);
          std::operator<<(poVar8,"\n");
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2_1);
        }
        pcVar6 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        local_4f8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4f8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_4f8);
        cmake::IssueMessage(pcVar6,AUTHOR_WARNING,&local_4e0,&local_4f8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_4f8);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_480);
      }
      pcVar6 = this->CMakeInstance;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_518,"Generating done",&local_519);
      cmake::UpdateProgress(pcVar6,&local_518,-1.0);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      return;
    }
    local_d8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
               ::operator*(&__end1);
    bVar1 = cmExportFileGenerator::GenerateImportFile
                      (&local_d8->second->super_cmExportFileGenerator);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
    ::operator++(&__end1);
  }
  bVar1 = cmSystemTools::GetErrorOccuredFlag();
  if (bVar1) {
    return;
  }
  pcVar6 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Could not write export file.",&local_f9);
  local_118.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_118.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace(&local_118);
  cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_f8,&local_118);
  cmListFileBacktrace::~cmListFileBacktrace(&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating",
      (static_cast<float>(i) + 1.0f) /
        static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(nullptr);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (auto& buildExpSet : this->BuildExportSets) {
    if (!buildExpSet.second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccuredFlag()) {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator) {
    this->ExtraGenerator->Generate();
  }

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::string const& t : this->CMP0042WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::string const& t : this->CMP0068WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}